

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O2

void __thiscall libcalc::Tokenizer::clear(Tokenizer *this)

{
  pointer ppTVar1;
  Token *this_00;
  vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *__range1;
  pointer ppTVar2;
  
  ppTVar1 = (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar2 = (this->tokens).
                 super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar2 != ppTVar1; ppTVar2 = ppTVar2 + 1) {
    this_00 = *ppTVar2;
    if (this_00 != (Token *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete(this_00);
  }
  ppTVar2 = (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppTVar2) {
    (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar2;
  }
  return;
}

Assistant:

void Tokenizer::clear() {
  for (Token *t : tokens) {
    delete t;
  }

  tokens.clear();
}